

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

double units::convert<units::unit,units::precise_unit>(double val,unit *start,precise_unit *result)

{
  bool bVar1;
  unit_data uVar2;
  uint uVar3;
  precise_unit *in_RSI;
  precise_unit *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double converted_val_3;
  double converted_val_2;
  unit_data base_result;
  unit_data base_start;
  double genBase;
  double converted_val_1;
  double keyval;
  double converted_val;
  precise_unit *in_stack_fffffffffffffee8;
  precise_unit *in_stack_fffffffffffffef0;
  precise_unit *in_stack_fffffffffffffef8;
  unit *in_stack_ffffffffffffff00;
  unit *in_stack_ffffffffffffff08;
  bool local_e9;
  unit_data *in_stack_ffffffffffffff28;
  precise_unit *in_stack_ffffffffffffff38;
  unit *in_stack_ffffffffffffff40;
  precise_unit *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar6;
  precise_unit *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  precise_unit *in_stack_ffffffffffffff68;
  unit_data in_stack_ffffffffffffff70;
  unit_data in_stack_ffffffffffffff74;
  double in_stack_ffffffffffffff78;
  unit_data local_38;
  unit_data local_34;
  double local_30;
  unit_data local_24;
  precise_unit *local_20;
  precise_unit *local_18;
  double local_10;
  double local_8;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_10 = in_XMM0_Qa;
  bVar1 = operator==((unit *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (((bVar1) || (bVar1 = is_default((unit *)in_stack_fffffffffffffef0), bVar1)) ||
     (bVar1 = is_default(in_stack_fffffffffffffef0), bVar1)) {
    return local_10;
  }
  bVar1 = unit::has_e_flag((unit *)0x3b4fb1);
  if (!bVar1) {
    bVar1 = precise_unit::has_e_flag((precise_unit *)0x3b4fc2);
    uVar6 = false;
    if (!bVar1) goto LAB_003b5008;
  }
  in_stack_ffffffffffffff48 = local_18;
  local_24 = precise_unit::base_units(local_20);
  uVar6 = unit::has_same_base((unit *)in_stack_fffffffffffffef0,
                              (unit_data *)in_stack_fffffffffffffee8);
LAB_003b5008:
  if ((bool)uVar6 != false) {
    local_30 = detail::convertFlaggedUnits<units::unit,units::precise_unit>
                         (in_stack_ffffffffffffff78,
                          (unit *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff68,
                          (double)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    uVar3 = std::isnan(local_30);
    if ((uVar3 & 1) == 0) {
      return local_30;
    }
  }
  bVar1 = unit::is_equation((unit *)0x3b5079);
  if ((bVar1) || (bVar1 = precise_unit::is_equation((precise_unit *)0x3b508a), bVar1)) {
    local_34 = unit::base_units((unit *)local_18);
    local_38 = precise_unit::base_units(local_20);
    bVar1 = detail::unit_data::equivalent_non_counting(&local_34,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      unit::base_units((unit *)local_18);
      precise::equations::convert_equnit_to_value
                ((double)in_stack_ffffffffffffff58,
                 (unit_data *)CONCAT17(uVar6,in_stack_ffffffffffffff50));
      unit::multiplier((unit *)local_18);
      precise_unit::multiplier(local_20);
      precise_unit::base_units(local_20);
      local_8 = precise::equations::convert_value_to_equnit
                          ((double)in_stack_ffffffffffffff68,
                           (unit_data *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    else {
      local_8 = NAN;
    }
  }
  else {
    unit::base_units((unit *)local_18);
    precise_unit::base_units(local_20);
    bVar1 = detail::unit_data::operator==
                      ((unit_data *)in_stack_ffffffffffffff00,(unit_data *)in_stack_fffffffffffffef8
                      );
    if (bVar1) {
      dVar4 = unit::multiplier((unit *)local_18);
      local_8 = precise_unit::multiplier(local_20);
      local_8 = (local_10 * dVar4) / local_8;
    }
    else {
      bVar1 = unit::is_per_unit((unit *)0x3b526a);
      if ((bVar1) && (bVar1 = precise_unit::is_per_unit((precise_unit *)0x3b5280), bVar1)) {
        unit_cast((unit *)local_18);
        bVar1 = unit::operator==((unit *)in_stack_fffffffffffffef8,(unit *)in_stack_fffffffffffffef0
                                );
        local_e9 = true;
        if (!bVar1) {
          unit_cast(in_stack_fffffffffffffef8);
          local_e9 = unit::operator==((unit *)in_stack_fffffffffffffef8,
                                      (unit *)in_stack_fffffffffffffef0);
        }
        if (local_e9 != false) {
          return local_10;
        }
        unit::base_units((unit *)local_18);
        precise_unit::base_units(local_20);
        dVar4 = puconversion::knownConversions
                          ((double)in_stack_ffffffffffffff68,
                           (unit_data *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (unit_data *)in_stack_ffffffffffffff58);
        uVar3 = std::isnan(dVar4);
        if ((uVar3 & 1) == 0) {
          return dVar4;
        }
      }
      else {
        bVar1 = unit::is_per_unit((unit *)0x3b53a3);
        if ((bVar1) || (bVar1 = precise_unit::is_per_unit((precise_unit *)0x3b53b4), bVar1)) {
          unit_cast((unit *)local_18);
          unit_cast(in_stack_fffffffffffffef8);
          dVar4 = puconversion::assumedBase(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
          uVar3 = std::isnan(dVar4);
          if ((uVar3 & 1) == 0) {
            dVar4 = convert<units::unit,units::precise_unit>
                              ((double)in_stack_ffffffffffffff68,
                               (unit *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                               ,in_stack_ffffffffffffff58,
                               (double)CONCAT17(uVar6,in_stack_ffffffffffffff50));
            return dVar4;
          }
          return NAN;
        }
      }
      unit::base_units((unit *)local_18);
      precise_unit::base_units(local_20);
      bVar1 = detail::unit_data::has_same_base
                        ((unit_data *)in_stack_ffffffffffffff00,
                         (unit_data *)in_stack_fffffffffffffef8);
      if (bVar1) {
        dVar4 = unit::multiplier((unit *)local_18);
        dVar4 = local_10 * dVar4;
        local_8 = precise_unit::multiplier(local_20);
        local_8 = dVar4 / local_8;
      }
      else {
        bVar1 = detail::unit_data::equivalent_non_counting
                          ((unit_data *)&stack0xffffffffffffff74,
                           (unit_data *)&stack0xffffffffffffff70);
        if (bVar1) {
          in_stack_ffffffffffffff68 =
               (precise_unit *)
               detail::convertCountingUnits<units::unit,units::precise_unit>
                         ((double)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
          uVar3 = std::isnan((double)in_stack_ffffffffffffff68);
          if ((uVar3 & 1) == 0) {
            return (double)in_stack_ffffffffffffff68;
          }
        }
        uVar2 = detail::unit_data::inv(in_stack_ffffffffffffff28);
        bVar1 = detail::unit_data::has_same_base
                          ((unit_data *)in_stack_ffffffffffffff00,
                           (unit_data *)in_stack_fffffffffffffef8);
        if (bVar1) {
          dVar4 = unit::multiplier((unit *)local_18);
          dVar4 = local_10 * dVar4;
          dVar5 = precise_unit::multiplier(local_20);
          local_8 = 1.0 / (dVar4 * dVar5);
        }
        else {
          bVar1 = unit::has_e_flag((unit *)0x3b55ff);
          if ((bVar1) || (bVar1 = precise_unit::has_e_flag((precise_unit *)0x3b5610), bVar1)) {
            in_stack_ffffffffffffff58 =
                 (precise_unit *)
                 detail::extraValidConversions<units::unit,units::precise_unit>
                           ((double)in_stack_ffffffffffffff58,
                            (unit *)CONCAT17(uVar6,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff48);
            uVar3 = std::isnan((double)in_stack_ffffffffffffff58);
            if ((uVar3 & 1) == 0) {
              return (double)in_stack_ffffffffffffff58;
            }
          }
          local_8 = detail::otherUsefulConversions<units::unit,units::precise_unit>
                              ((double)in_stack_ffffffffffffff68,
                               (unit *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff58);
        }
      }
    }
  }
  return local_8;
}

Assistant:

double convert(double val, const UX& start, const UX2& result)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if ((start.has_e_flag() || result.has_e_flag()) &&
        start.has_same_base(result.base_units())) {
        double converted_val = detail::convertFlaggedUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    if (start.is_equation() || result.is_equation()) {
        if (!start.base_units().equivalent_non_counting(result.base_units())) {
            return constants::invalid_conversion;
        }
        double keyval = precise::equations::convert_equnit_to_value(
            val, start.base_units());
        keyval = keyval * start.multiplier() / result.multiplier();
        return precise::equations::convert_value_to_equnit(
            keyval, result.base_units());
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }
    // check if both are pu since this doesn't require knowing a base unit
    if (start.is_per_unit() &&
        result.is_per_unit()) {  // we know they have different unit basis
        if (unit_cast(start) == pu || unit_cast(result) == pu) {
            // generic pu just means the units are equivalent since the other is
            // puXX already
            return val;
        }
        double converted_val = puconversion::knownConversions(
            val, start.base_units(), result.base_units());
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    } else if (start.is_per_unit() || result.is_per_unit()) {
        double genBase =
            puconversion::assumedBase(unit_cast(start), unit_cast(result));
        if (!std::isnan(genBase)) {
            return convert(val, start, result, genBase);
        }
        // other assumptions for PU base are probably dangerous so shouldn't be
        // allowed
        return constants::invalid_conversion;
    }

    auto base_start = start.base_units();
    auto base_result = result.base_units();
    if (base_start.has_same_base(base_result)) {
        // ignore i flag and e flag, special cases have been dealt with already,
        // so those are just markers
        return val * start.multiplier() / result.multiplier();
    }
    // deal with some counting conversions
    if (base_start.equivalent_non_counting(base_result)) {
        double converted_val = detail::convertCountingUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // check for inverse units
    if (base_start.has_same_base(base_result.inv())) {
        // ignore flag and e flag  special cases have been dealt with already,
        // so those are just markers
        return 1.0 / (val * start.multiplier() * result.multiplier());
    }
    if (start.has_e_flag() || result.has_e_flag()) {
        double converted_val =
            detail::extraValidConversions(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // this is the last chance and will return invalid_result if it doesn't find
    // a match
    return detail::otherUsefulConversions(val, start, result);
}